

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

bool QtPrivate::QTypeNormalizer::starts_with_token(char *b,char *e,char *token,bool msvcKw)

{
  byte bVar1;
  char *pcVar2;
  
  pcVar2 = token;
  if (b != e) {
    pcVar2 = token + ((long)e - (long)b);
    do {
      bVar1 = *b;
      if (*token == 0) {
        return (bVar1 != 0x5f && (byte)(bVar1 - 0x3a) < 0xf6) &&
               (byte)((bVar1 & 0xdf) + 0xa5) < 0xe6;
      }
      if (bVar1 != *token) {
        return false;
      }
      b = (char *)((byte *)b + 1);
      token = (char *)((byte *)token + 1);
    } while (b != e);
  }
  return *pcVar2 == '\0';
}

Assistant:

static constexpr bool starts_with_token(const char *b, const char *e, const char *token,
                                            bool msvcKw = false)
    {
        while (b != e && *token && *b == *token) {
            b++;
            token++;
        }
        if (*token)
            return false;
#ifdef Q_CC_MSVC
        /// On MSVC, keywords like class or struct are not separated with spaces in constexpr
        /// context
        if (msvcKw && !is_ident_char(*b))
            return true;
#endif
        Q_UNUSED(msvcKw);
        return b == e || !is_ident_char(*b);
    }